

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.cpp
# Opt level: O0

error_code __thiscall
simdjson::fallback::implementation::minify
          (implementation *this,uint8_t *buf,size_t len,uint8_t *dst,size_t *dst_len)

{
  error_code eVar1;
  long lVar2;
  uint8_t *meta;
  uchar c;
  uint8_t nonescape;
  size_t sStack_40;
  uint8_t quote;
  size_t pos;
  size_t i;
  size_t *dst_len_local;
  uint8_t *dst_local;
  size_t len_local;
  uint8_t *buf_local;
  implementation *this_local;
  
  sStack_40 = 0;
  meta._7_1_ = 0;
  meta._6_1_ = 1;
  for (pos = 0; pos < len; pos = pos + 1) {
    lVar2 = (long)(int)((uint)buf[pos] * 3);
    meta._7_1_ = meta._7_1_ ^ jump_table[lVar2] & meta._6_1_;
    dst[sStack_40] = buf[pos];
    sStack_40 = (long)(int)(uint)(jump_table[lVar2 + 2] | meta._7_1_) + sStack_40;
    meta._6_1_ = meta._6_1_ ^ 0xff | jump_table[lVar2 + 1];
  }
  *dst_len = sStack_40;
  eVar1 = SUCCESS;
  if (meta._7_1_ != 0) {
    eVar1 = UNCLOSED_STRING;
  }
  return eVar1;
}

Assistant:

simdjson_warn_unused error_code implementation::minify(const uint8_t *buf, size_t len, uint8_t *dst, size_t &dst_len) const noexcept {
  size_t i = 0, pos = 0;
  uint8_t quote = 0;
  uint8_t nonescape = 1;

  while (i < len) {
    unsigned char c = buf[i];
    uint8_t *meta = jump_table + 3 * c;

    quote = quote ^ (meta[0] & nonescape);
    dst[pos] = c;
    pos += meta[2] | quote;

    i += 1;
    nonescape = uint8_t(~nonescape) | (meta[1]);
  }
  dst_len = pos; // we intentionally do not work with a reference
  // for fear of aliasing
  return quote ? UNCLOSED_STRING : SUCCESS;
}